

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_wString __thiscall
ON_SubDToBrepParameters::VertexProcessToString
          (ON_SubDToBrepParameters *this,VertexProcess vertex_process)

{
  wchar_t *s;
  
  if (vertex_process < (LocalG1xx|LocalG1)) {
    s = (wchar_t *)(&DAT_006ce5c0 + *(int *)(&DAT_006ce5c0 + (ulong)vertex_process * 4));
  }
  else {
    s = L"INVALID";
  }
  ON_wString::ON_wString((ON_wString *)this,s);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDToBrepParameters::VertexProcessToString(
  ON_SubDToBrepParameters::VertexProcess vertex_process
)
{
  const wchar_t* s;
  switch (vertex_process)
  {
  case ON_SubDToBrepParameters::VertexProcess::None:
    s = L"None";
    break;
  case ON_SubDToBrepParameters::VertexProcess::LocalG1:
    s = L"G1";
    break;
  case ON_SubDToBrepParameters::VertexProcess::LocalG2:
    s = L"G2";
    break;
  case ON_SubDToBrepParameters::VertexProcess::LocalG1x:
    s = L"G1x";
    break;
  case ON_SubDToBrepParameters::VertexProcess::LocalG1xx:
    s = L"G1xx";
    break;
  default:
    s = L"INVALID";
    break;
  }
  return ON_wString(s);
}